

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslcipher.cpp
# Opt level: O2

void __thiscall QSslCipher::QSslCipher(QSslCipher *this,QString *name,SslProtocol protocol)

{
  SslProtocol SVar1;
  bool bVar2;
  _Head_base<0UL,_QSslCipherPrivate_*,_false> _Var3;
  long lVar4;
  QSslCipher *this_00;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_70;
  QArrayDataPointer<QSslCipher> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  _Var3._M_head_impl = (QSslCipherPrivate *)operator_new(0x98);
  (_Var3._M_head_impl)->isNull = true;
  *(qsizetype *)((long)&(_Var3._M_head_impl)->protocolString + 0x10) = 0;
  ((_Var3._M_head_impl)->protocolString).d.d = 0;
  *(char16_t **)((long)&(_Var3._M_head_impl)->protocolString + 8) = (char16_t *)0x0;
  ((_Var3._M_head_impl)->name).d.d = 0;
  *(char16_t **)((long)&(_Var3._M_head_impl)->name + 8) = (char16_t *)0x0;
  *(qsizetype *)((long)&(_Var3._M_head_impl)->name + 0x10) = 0;
  (_Var3._M_head_impl)->supportedBits = 0;
  (_Var3._M_head_impl)->bits = 0;
  ((_Var3._M_head_impl)->keyExchangeMethod).d.d = 0;
  *(char16_t **)((long)&(_Var3._M_head_impl)->keyExchangeMethod + 8) = (char16_t *)0x0;
  *(qsizetype *)((long)&(_Var3._M_head_impl)->keyExchangeMethod + 0x10) = 0;
  ((_Var3._M_head_impl)->authenticationMethod).d.d = 0;
  *(char16_t **)((long)&(_Var3._M_head_impl)->authenticationMethod + 8) = (char16_t *)0x0;
  *(qsizetype *)((long)&(_Var3._M_head_impl)->authenticationMethod + 0x10) = 0;
  ((_Var3._M_head_impl)->encryptionMethod).d.d = 0;
  *(char16_t **)((long)&(_Var3._M_head_impl)->encryptionMethod + 8) = (char16_t *)0x0;
  *(undefined8 *)((long)&(_Var3._M_head_impl)->encryptionMethod + 9) = 0;
  *(undefined8 *)((long)&(_Var3._M_head_impl)->encryptionMethod + 0x11) = 0;
  (_Var3._M_head_impl)->protocol = UnknownProtocol;
  (this->d)._M_t.super___uniq_ptr_impl<QSslCipherPrivate,_std::default_delete<QSslCipherPrivate>_>.
  _M_t.super__Tuple_impl<0UL,_QSslCipherPrivate_*,_std::default_delete<QSslCipherPrivate>_>.
  super__Head_base<0UL,_QSslCipherPrivate_*,_false>._M_head_impl = _Var3._M_head_impl;
  local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.ptr = (QSslCipher *)&DAT_aaaaaaaaaaaaaaaa;
  QSslConfiguration::supportedCiphers();
  lVar4 = local_58.size << 3;
  this_00 = local_58.ptr;
  do {
    if (lVar4 == 0) {
LAB_00229ea3:
      QArrayDataPointer<QSslCipher>::~QArrayDataPointer(&local_58);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return;
      }
      __stack_chk_fail();
    }
    QSslCipher::name((QString *)&local_70,this_00);
    bVar2 = comparesEqual((QString *)&local_70,name);
    if (bVar2) {
      SVar1 = ((this_00->d)._M_t.
               super___uniq_ptr_impl<QSslCipherPrivate,_std::default_delete<QSslCipherPrivate>_>.
               _M_t.
               super__Tuple_impl<0UL,_QSslCipherPrivate_*,_std::default_delete<QSslCipherPrivate>_>.
               super__Head_base<0UL,_QSslCipherPrivate_*,_false>._M_head_impl)->protocol;
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
      if (SVar1 == protocol) {
        operator=(this,this_00);
        goto LAB_00229ea3;
      }
    }
    else {
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
    }
    this_00 = this_00 + 1;
    lVar4 = lVar4 + -8;
  } while( true );
}

Assistant:

QSslCipher::QSslCipher(const QString &name, QSsl::SslProtocol protocol)
    : d(new QSslCipherPrivate)
{
    const auto ciphers = QSslConfiguration::supportedCiphers();
    for (const QSslCipher &cipher : ciphers) {
        if (cipher.name() == name && cipher.protocol() == protocol) {
            *this = cipher;
            return;
        }
    }
}